

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::build
          (CollationDataBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  CollationData *data_local;
  CollationDataBuilder *this_local;
  
  buildMappings(this,data,errorCode);
  if (this->base != (CollationData *)0x0) {
    data->numericPrimary = this->base->numericPrimary;
    data->compressibleBytes = this->base->compressibleBytes;
    data->numScripts = this->base->numScripts;
    data->scriptsIndex = this->base->scriptsIndex;
    data->scriptStarts = this->base->scriptStarts;
    data->scriptStartsLength = this->base->scriptStartsLength;
  }
  buildFastLatinTable(this,data,errorCode);
  return;
}

Assistant:

void
CollationDataBuilder::build(CollationData &data, UErrorCode &errorCode) {
    buildMappings(data, errorCode);
    if(base != NULL) {
        data.numericPrimary = base->numericPrimary;
        data.compressibleBytes = base->compressibleBytes;
        data.numScripts = base->numScripts;
        data.scriptsIndex = base->scriptsIndex;
        data.scriptStarts = base->scriptStarts;
        data.scriptStartsLength = base->scriptStartsLength;
    }
    buildFastLatinTable(data, errorCode);
}